

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.h
# Opt level: O3

size_t __thiscall CTcHashEntryPpFILE::get_expan_len(CTcHashEntryPpFILE *this)

{
  CTcTokenizer *pCVar1;
  CTcTokFileDesc *pCVar2;
  size_t sVar3;
  
  pCVar1 = (this->super_CTcHashEntryPpSpecial).tok_;
  pCVar2 = pCVar1->last_desc_;
  if (pCVar2 != (CTcTokFileDesc *)0x0) {
    sVar3 = strlen(*(char **)((long)&pCVar2->squoted_fname_ + (ulong)(*(byte *)pCVar1 & 8)));
    return sVar3;
  }
  sVar3 = strlen("");
  return sVar3;
}

Assistant:

const char *get_base_text() const
    {
        /* 
         *   if we're in test-report mode, use the root name only;
         *   otherwise, use the full name with path 
         */
        if (tok_->get_last_desc() == 0)
            return "";
        else if (tok_->get_test_report_mode())
            return tok_->get_last_desc()->get_squoted_rootname();
        else
            return tok_->get_last_desc()->get_squoted_fname();
    }